

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O2

char * __thiscall HttpHeaderBase::getField(HttpHeaderBase *this,FieldType type)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(uint)this->mNumFields;
  if (this->mNumFields < 1) {
    uVar2 = 0;
  }
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (uVar2 * 0x10 + 0x10 == lVar3 + 0x10) {
      return (char *)0x0;
    }
    lVar1 = lVar3 + 0x10;
  } while (*(int *)((long)&this->mFields[0].mType + lVar3) != type);
  return *(char **)((long)&this->mFields[0].mData + lVar3);
}

Assistant:

const char *HttpHeaderBase::getField(FieldMap::FieldType type) const
{
	for (int i = 0; i < mNumFields; i++)
	{
		if (mFields[i].mType == type)
			return mFields[i].mData;
	}
	
	return NULL;
}